

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O3

string * __thiscall
t_html_generator::escape_html_tags
          (string *__return_storage_ptr__,t_html_generator *this,string *str)

{
  byte bVar1;
  char cVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  string *psVar5;
  int iVar6;
  ulong uVar7;
  iterator iVar8;
  ostream *poVar9;
  ulong uVar10;
  string *__range2;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  string tag_key;
  string tag_content;
  ostringstream tagstream;
  ostringstream result;
  key_type local_398;
  char local_378;
  undefined7 uStack_377;
  long local_370;
  undefined1 local_368 [16];
  string *local_358;
  _Base_ptr local_350;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_348;
  char *local_340;
  long local_338;
  char local_330 [16];
  char *local_320;
  long local_318;
  char local_310 [96];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  local_358 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar7 = str->_M_string_length;
  if (uVar7 != 0) {
    local_348 = &this->allowed_markup;
    local_350 = &(this->allowed_markup)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar13 = 0;
    do {
      uVar10 = uVar13 + 1;
      uVar11 = uVar13;
      if (uVar13 + 1 < uVar7) {
        uVar10 = uVar7;
      }
      do {
        bVar1 = (str->_M_dataplus)._M_p[uVar11];
        uVar12 = uVar11;
        if ((bVar1 & 0xfd) == 0x3c) break;
        uVar11 = uVar11 + 1;
        uVar12 = uVar10;
      } while (uVar10 != uVar11);
      if (uVar13 < uVar12) {
        std::__cxx11::string::substr((ulong)&local_320,(ulong)str);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,local_318)
        ;
        if (local_320 != local_310) {
          operator_delete(local_320);
        }
        uVar7 = str->_M_string_length;
        uVar13 = uVar12;
      }
      if (uVar7 <= uVar13) break;
      uVar13 = uVar13 + 1;
      if (bVar1 == 0x3e) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&gt;",4);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        if (uVar13 < str->_M_string_length) {
          do {
            uVar7 = uVar13;
            cVar2 = (str->_M_dataplus)._M_p[uVar7];
            if (cVar2 == '<') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"&lt;",4);
            }
            else {
              if (cVar2 == '>') break;
              local_378 = cVar2;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,&local_378,1)
              ;
            }
            uVar13 = uVar7 + 1;
          } while (uVar7 + 1 < str->_M_string_length);
          uVar13 = uVar7 + 1;
        }
        std::__cxx11::stringbuf::str();
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,CONCAT71(uStack_377,local_378),
                   local_370 + CONCAT71(uStack_377,local_378));
        uVar7 = std::__cxx11::string::find_first_of((char *)&local_398,0x3913f2,0);
        _Var3._M_p = local_398._M_dataplus._M_p;
        if (uVar7 != 0xffffffffffffffff) {
          if (local_398._M_string_length < uVar7) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase",uVar7);
          }
          local_398._M_dataplus._M_p[uVar7] = '\0';
          local_398._M_string_length = uVar7;
        }
        sVar4 = local_398._M_string_length;
        if (local_398._M_string_length != 0) {
          uVar7 = 0;
          do {
            iVar6 = tolower((int)_Var3._M_p[uVar7]);
            _Var3._M_p[uVar7] = (char)iVar6;
            uVar7 = uVar7 + 1;
          } while (sVar4 != uVar7);
        }
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_348->_M_t,&local_398);
        if (iVar8._M_node == local_350) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&lt;",4);
          std::__cxx11::stringbuf::str();
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_340,local_338);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&gt;",4);
          if (local_340 != local_330) {
            operator_delete(local_340);
          }
          pverbose("illegal markup <%s> in doc-comment\n",local_398._M_dataplus._M_p);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)CONCAT71(uStack_377,local_378),local_370)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,">",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(uStack_377,local_378) != local_368) {
          operator_delete((undefined1 *)CONCAT71(uStack_377,local_378));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
        std::ios_base::~ios_base(local_2b0);
      }
      uVar7 = str->_M_string_length;
    } while (uVar13 < uVar7);
  }
  psVar5 = local_358;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

std::string t_html_generator::escape_html_tags(std::string const& str) {
  std::ostringstream result;

  unsigned char c = '?';
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      if (('<' == c) || ('>' == c)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // tag end without corresponding begin
    ++firstpos;
    if ('>' == c) {
      result << "&gt;";
      continue;
    }

    // extract the tag
    std::ostringstream tagstream;
    while (firstpos < str.length()) {
      c = str.at(firstpos);
      ++firstpos;
      if ('<' == c) {
        tagstream << "&lt;"; // nested begin?
      } else if ('>' == c) {
        break;
      } else {
        tagstream << c; // not very efficient, but tags should be quite short
      }
    }

    // we allow for several markup in docstrings, all else will become escaped
    string tag_content = tagstream.str();
    string tag_key = tag_content;
    size_t first_white = tag_key.find_first_of(" \t\f\v\n\r");
    if (first_white != string::npos) {
      tag_key.erase(first_white);
    }
    for (char & i : tag_key) {
      i = tolower(i);
    }
    if (allowed_markup.find(tag_key) != allowed_markup.end()) {
      result << "<" << tag_content << ">";
    } else {
      result << "&lt;" << tagstream.str() << "&gt;";
      pverbose("illegal markup <%s> in doc-comment\n", tag_key.c_str());
    }
  }

  return result.str();
}